

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O0

void __thiscall
VideoHppGenerator::readTypeStruct
          (VideoHppGenerator *this,XMLElement *element,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *attributes)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_> *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_03;
  undefined8 element_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  int iVar3;
  reference ppXVar4;
  char *__s;
  pointer ppVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_bool>
  pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>,_bool>
  pVar7;
  bool local_8ba;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_778;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_760;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_748;
  allocator<char> local_6c9;
  undefined1 local_6c8 [8];
  string value;
  XMLElement *child;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
  local_678;
  _Base_ptr local_638;
  undefined1 local_630;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>
  local_628;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  _Base_ptr local_5e0;
  byte local_5d8;
  TypeData local_5d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
  local_590;
  _Base_ptr local_530;
  byte local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  reference local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attribute;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string require;
  string name;
  StructureData structureData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined1 local_3f0 [69];
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_3ab;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3aa;
  bool local_3a9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *local_3a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_3a0;
  undefined1 local_378 [64];
  undefined1 local_338 [8];
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> children;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  undefined1 local_210 [69];
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1cb;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1ca;
  undefined1 local_1c9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18f;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_18e;
  undefined1 local_18d;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [64];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  undefined1 local_68 [68];
  int local_24;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmStack_20;
  int line;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *attributes_local;
  XMLElement *element_local;
  VideoHppGenerator *this_local;
  
  pmStack_20 = attributes;
  attributes_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)element;
  element_local = (XMLElement *)this;
  iVar3 = tinyxml2::XMLNode::GetLineNum(&element->super_XMLNode);
  pmVar1 = pmStack_20;
  local_1c9 = 1;
  local_110 = &local_108;
  local_18d = 1;
  local_178 = &local_170;
  local_24 = iVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"struct",&local_179);
  local_18d = 0;
  local_150._0_8_ = &local_170;
  local_150._8_8_ = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_18f);
  __l_02._M_len = local_150._8_8_;
  __l_02._M_array = (iterator)local_150._0_8_;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(local_150 + 0x10),__l_02,&local_18e,&local_18f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[9],_true>
            (&local_108,(char (*) [9])"category",
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_150 + 0x10));
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1c8._M_t._M_impl._0_8_ = 0;
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_110 = &local_b8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_1c8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[5],_true>(&local_b8,(char (*) [5])"name",&local_1c8);
  local_1c9 = 0;
  local_68._0_8_ = &local_108;
  local_68._8_8_ = 2;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::allocator(&local_1cb);
  __l_03._M_len = local_68._8_8_;
  __l_03._M_array = (iterator)local_68._0_8_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)(local_68 + 0x10),__l_03,&local_1ca,&local_1cb);
  children.
  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  local_2e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_2e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_2e8._M_t._M_impl._0_8_ = 0;
  local_2e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_2b8 = &local_2b0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_2e8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[8],_true>(&local_2b0,(char (*) [8])"comment",&local_2e8);
  local_318._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_318._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_318._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_318._M_t._M_impl._0_8_ = 0;
  local_318._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_318._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_2b8 = &local_260;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_318);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[9],_true>(&local_260,(char (*) [9])"requires",&local_318);
  children.
  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  local_210._0_8_ = &local_2b0;
  local_210._8_8_ = 2;
  this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&children.
                       super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::allocator(this_00);
  __l_01._M_len = local_210._8_8_;
  __l_01._M_array = (iterator)local_210._0_8_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)(local_210 + 0x10),__l_01,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&children.
                super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),this_00);
  checkAttributes(iVar3,pmVar1,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)(local_68 + 0x10),
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)(local_210 + 0x10));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)(local_210 + 0x10));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)((long)&children.
                          super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_748 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_210;
  do {
    local_748 = local_748 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair(local_748);
  } while (local_748 != &local_2b0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_318);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_2e8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)(local_68 + 0x10));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~allocator(&local_1cb);
  local_760 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_68;
  do {
    local_760 = local_760 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair(local_760);
  } while (local_760 != &local_108);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_1c8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(local_150 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_18f);
  local_778 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
  do {
    local_778 = local_778 + -1;
    std::__cxx11::string::~string((string *)local_778);
  } while (local_778 != &local_170);
  std::allocator<char>::~allocator(&local_179);
  getChildElements<tinyxml2::XMLElement>
            ((vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> *)
             local_338,(XMLElement *)attributes_local);
  iVar3 = local_24;
  local_3a8 = &local_3a0;
  local_3a9 = false;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  ::pair<const_char_(&)[7],_bool,_true>(local_3a8,(char (*) [7])"member",&local_3a9);
  local_378._0_8_ = &local_3a0;
  local_378._8_8_ = 1;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::allocator(&local_3ab);
  __l_00._M_len = local_378._8_8_;
  __l_00._M_array = (iterator)local_378._0_8_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)(local_378 + 0x10),__l_00,&local_3aa,&local_3ab);
  structureData._30_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"comment",(allocator<char> *)&structureData.field_0x1f);
  structureData._30_1_ = 0;
  local_3f0._0_8_ = &local_410;
  local_3f0._8_8_ = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&structureData.field_0x1c);
  __l._M_len = local_3f0._8_8_;
  __l._M_array = (iterator)local_3f0._0_8_;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(local_3f0 + 0x10),__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &structureData.field_0x1d,(allocator_type *)&structureData.field_0x1c);
  checkElements(iVar3,(vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                       *)local_338,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)(local_378 + 0x10),
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3f0 + 0x10));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(local_3f0 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&structureData.field_0x1c);
  local_7b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0;
  do {
    local_7b8 = local_7b8 + -1;
    std::__cxx11::string::~string((string *)local_7b8);
  } while (local_7b8 != &local_410);
  std::allocator<char>::~allocator((allocator<char> *)&structureData.field_0x1f);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)(local_378 + 0x10));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::~allocator(&local_3ab);
  local_7d0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
               *)local_378;
  do {
    local_7d0 = local_7d0 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::~pair(local_7d0);
  } while (local_7d0 != &local_3a0);
  this_01 = (vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_> *
            )((long)&name.field_2 + 8);
  memset(this_01,0,0x18);
  std::vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>::vector
            (this_01);
  structureData.members.
  super__Vector_base<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_24;
  std::__cxx11::string::string((string *)(require.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range1);
  pmVar1 = pmStack_20;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(pmStack_20);
  attribute = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(pmVar1);
  while (bVar2 = std::operator==(&__end1,(_Self *)&attribute), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_4a0 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1);
    bVar2 = std::operator==(&local_4a0->first,"name");
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&require.field_2 + 8),&local_4a0->second);
    }
    else {
      bVar2 = std::operator==(&local_4a0->first,"requires");
      if (bVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                   &local_4a0->second);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&require.field_2 + 8));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range1);
    local_8ba = true;
    if (!bVar2) {
      local_8ba = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                  ::contains(&this->m_types,(key_type *)&__range1);
    }
    iVar3 = local_24;
    std::operator+(&local_520,"struct <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&require.field_2 + 8));
    std::operator+(&local_500,&local_520,"> requires unknown type <");
    std::operator+(&local_4e0,&local_500,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
    std::operator+(&local_4c0,&local_4e0,">");
    checkForError(local_8ba,iVar3,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_520);
    local_5d0.category = Struct;
    local_5d0.requiredBy._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_5d0.requiredBy._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_5d0.requiredBy._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_5d0.requiredBy._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_5d0.requiredBy._M_t._M_impl._0_8_ = 0;
    local_5d0.requiredBy._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_5d0.requiredBy._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_5d0.requiredBy);
    local_5d0.xmlLine = local_24;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TypeData,_true>
              (&local_590,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&require.field_2 + 8),&local_5d0);
    pVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
            ::insert(&this->m_types,&local_590);
    iVar3 = local_24;
    local_5e0 = (_Base_ptr)pVar6.first._M_node;
    bVar2 = pVar6.second;
    local_5d8 = bVar2;
    local_530 = local_5e0;
    local_528 = bVar2;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   "struct <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&require.field_2 + 8));
    std::operator+(&local_600,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   "> already specified");
    checkForError((bool)(bVar2 & 1),iVar3,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&it);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
    ::~pair(&local_590);
    TypeData::~TypeData(&local_5d0);
    bVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>_>
            ::contains(&this->m_structs,(key_type *)((long)&require.field_2 + 8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_VideoHppGenerator::StructureData_&,_true>
                (&local_678,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&require.field_2 + 8),(StructureData *)((long)&name.field_2 + 8));
      pVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>_>
              ::insert(&this->m_structs,&local_678);
      local_638 = (_Base_ptr)pVar7.first._M_node;
      local_630 = pVar7.second;
      local_628._M_node = local_638;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
      ::~pair(&local_678);
      __end1_1 = std::
                 vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                 ::begin((vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                          *)local_338);
      child = (XMLElement *)
              std::
              vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>::
              end((vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                   *)local_338);
      while (bVar2 = __gnu_cxx::
                     operator==<const_tinyxml2::XMLElement_**,_std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>_>
                               (&__end1_1,
                                (__normal_iterator<const_tinyxml2::XMLElement_**,_std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>_>
                                 *)&child), ((bVar2 ^ 0xffU) & 1) != 0) {
        ppXVar4 = __gnu_cxx::
                  __normal_iterator<const_tinyxml2::XMLElement_**,_std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>_>
                  ::operator*(&__end1_1);
        value.field_2._8_8_ = *ppXVar4;
        __s = tinyxml2::XMLNode::Value((XMLNode *)value.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_6c8,__s,&local_6c9);
        std::allocator<char>::~allocator(&local_6c9);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_6c8,"member");
        element_00 = value.field_2._8_8_;
        if (bVar2) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>
                   ::operator->(&local_628);
          readStructMember(this,(XMLElement *)element_00,&(ppVar5->second).members);
        }
        std::__cxx11::string::~string((string *)local_6c8);
        __gnu_cxx::
        __normal_iterator<const_tinyxml2::XMLElement_**,_std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>_>
        ::operator++(&__end1_1);
      }
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)(require.field_2._M_local_buf + 8));
      StructureData::~StructureData((StructureData *)((long)&name.field_2 + 8));
      std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>::
      ~vector((vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> *
              )local_338);
      return;
    }
    __assert_fail("!m_structs.contains( name )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                  ,0x36a,
                  "void VideoHppGenerator::readTypeStruct(const tinyxml2::XMLElement *, const std::map<std::string, std::string> &)"
                 );
  }
  __assert_fail("!name.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                ,0x367,
                "void VideoHppGenerator::readTypeStruct(const tinyxml2::XMLElement *, const std::map<std::string, std::string> &)"
               );
}

Assistant:

void VideoHppGenerator::readTypeStruct( tinyxml2::XMLElement const * element, std::map<std::string, std::string> const & attributes )
{
  int line = element->GetLineNum();
  checkAttributes( line, attributes, { { "category", { "struct" } }, { "name", {} } }, { { "comment", {} }, { "requires", {} } } );
  std::vector<tinyxml2::XMLElement const *> children = getChildElements( element );
  checkElements( line, children, { { "member", false } }, { "comment" } );

  StructureData structureData{ .xmlLine = line };

  std::string name, require;
  for ( auto const & attribute : attributes )
  {
    if ( attribute.first == "name" )
    {
      name = attribute.second;
    }
    else if ( attribute.first == "requires" )
    {
      require = attribute.second;
    }
  }
  assert( !name.empty() );
  checkForError( require.empty() || m_types.contains( require ), line, "struct <" + name + "> requires unknown type <" + require + ">" );
  checkForError( m_types.insert( { name, TypeData{ TypeCategory::Struct, {}, line } } ).second, line, "struct <" + name + "> already specified" );
  assert( !m_structs.contains( name ) );
  std::map<std::string, StructureData>::iterator it = m_structs.insert( { name, structureData } ).first;

  for ( auto child : children )
  {
    std::string value = child->Value();
    if ( value == "member" )
    {
      readStructMember( child, it->second.members );
    }
  }
}